

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skills.c
# Opt level: O0

bool style_check(int sn,int style)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  int gn;
  int in_stack_fffffffffffffff0;
  bool local_1;
  
  iVar2 = gn_skill_lookup(in_stack_fffffffffffffff0);
  if (iVar2 < 2) {
    local_1 = false;
  }
  else {
    bVar1 = str_cmp(group_table[iVar2].name,style_table[in_ESI].name);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool style_check(int sn, int style)
{
	int gn;

	if ((gn = gn_skill_lookup(sn)) > 1)
	{
		if (str_cmp(group_table[gn].name, style_table[style].name))
			return false;
		else
			return true;
	}
	else
	{
		return false;
	}
}